

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDHash::Compare(ON_SubDHash *lhs,ON_SubDHash *rhs)

{
  int iVar1;
  
  if (lhs->m_vertex_count < rhs->m_vertex_count) {
    return -1;
  }
  if (lhs->m_vertex_count <= rhs->m_vertex_count) {
    if (lhs->m_edge_count < rhs->m_edge_count) {
      return -1;
    }
    if (lhs->m_edge_count <= rhs->m_edge_count) {
      if (lhs->m_face_count < rhs->m_face_count) {
        return -1;
      }
      if (rhs->m_face_count < lhs->m_face_count) {
        return 1;
      }
      iVar1 = ON_SHA1_Hash::Compare(&lhs->m_vertex_hash,&rhs->m_vertex_hash);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = ON_SHA1_Hash::Compare(&lhs->m_edge_hash,&rhs->m_edge_hash);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = ON_SHA1_Hash::Compare(&lhs->m_face_hash,&rhs->m_face_hash);
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int ON_SubDHash::Compare(const ON_SubDHash& lhs, const ON_SubDHash& rhs)
{
  if (lhs.m_vertex_count < rhs.m_vertex_count)
    return -1;
  if (lhs.m_vertex_count > rhs.m_vertex_count)
    return 1;

  if (lhs.m_edge_count < rhs.m_edge_count)
    return -1;
  if (lhs.m_edge_count > rhs.m_edge_count)
    return 1;

  if (lhs.m_face_count < rhs.m_face_count)
    return -1;
  if (lhs.m_face_count > rhs.m_face_count)
    return 1;

  int rc;

  rc = ON_SHA1_Hash::Compare(lhs.m_vertex_hash, rhs.m_vertex_hash);
  if (0 != rc)
    return rc;

  rc = ON_SHA1_Hash::Compare(lhs.m_edge_hash, rhs.m_edge_hash);
  if (0 != rc)
    return rc;

  return ON_SHA1_Hash::Compare(lhs.m_face_hash, rhs.m_face_hash);
}